

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

int hwnet::http::HttpSession::on_header_field(http_parser *parser,char *at,size_t length)

{
  void *pvVar1;
  ulong uVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  mapped_type *this;
  HttpSession *session;
  size_t length_local;
  char *at_local;
  http_parser *parser_local;
  
  pvVar1 = parser->data;
  std::__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)((long)pvVar1 + 0x98));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    peVar3 = std::
             __shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)((long)pvVar1 + 0x98));
    peVar4 = std::
             __shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)((long)pvVar1 + 0x98));
    peVar5 = std::
             __shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)((long)pvVar1 + 0x98));
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar4->headers,&peVar5->field);
    std::__cxx11::string::operator=((string *)this,(string *)&peVar3->value);
    std::__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)((long)pvVar1 + 0x98));
    std::__cxx11::string::clear();
    std::__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)((long)pvVar1 + 0x98));
    std::__cxx11::string::clear();
  }
  peVar3 = std::
           __shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)((long)pvVar1 + 0x98));
  std::__cxx11::string::append((char *)&peVar3->field,(ulong)at);
  return 0;
}

Assistant:

int HttpSession::on_header_field(http_parser *parser, const char *at, size_t length) {
	auto session = (HttpSession*)parser->data;
	if(!session->packet->field.empty()) {
		session->packet->headers[session->packet->field] = session->packet->value;
		session->packet->field.clear();
		session->packet->value.clear();
	}
	session->packet->field.append(at,length);
	return 0;
}